

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_cb_prg.c
# Opt level: O0

int tool_progress_cb(void *clientp,double dltotal,double dlnow,double ultotal,double ulnow)

{
  int iVar1;
  long lVar2;
  long lVar3;
  long extraout_RDX;
  curl_off_t thisblock;
  curl_off_t prevblock;
  curl_off_t point;
  curl_off_t total;
  ProgressData *bar;
  int local_180;
  int i;
  int num;
  int barwidth;
  double percent;
  double frac;
  char format [40];
  undefined1 local_138 [8];
  char line [257];
  double ulnow_local;
  double ultotal_local;
  double dlnow_local;
  double dltotal_local;
  void *clientp_local;
  
  point = (long)dltotal + (long)ultotal + *(long *)((long)clientp + 0x20);
  lVar2 = (long)dlnow + (long)ulnow + *(long *)((long)clientp + 0x20);
  if (point < lVar2) {
    point = lVar2;
  }
  *(int *)clientp = *clientp + 1;
  unique0x1000015d = ulnow;
  if (point < 1) {
    lVar3 = lVar2 % 0x400;
    for (thisblock = *(long *)((long)clientp + 8) / 0x400; thisblock < lVar2 / 0x400;
        thisblock = thisblock + 1) {
      curl_mfprintf(*(undefined8 *)((long)clientp + 0x18),"#",lVar3);
      lVar3 = extraout_RDX;
    }
  }
  else if (lVar2 != *(long *)((long)clientp + 8)) {
    iVar1 = *(int *)((long)clientp + 0x10) + -7;
    local_180 = (int)((double)iVar1 * ((double)lVar2 / (double)point));
    if (0x100 < local_180) {
      local_180 = 0x100;
    }
    for (bar._4_4_ = 0; bar._4_4_ < local_180; bar._4_4_ = bar._4_4_ + 1) {
      local_138[bar._4_4_] = 0x23;
    }
    local_138[bar._4_4_] = 0;
    curl_msnprintf(&frac,0x28,"\r%%-%ds %%5.1f%%%%",iVar1);
    curl_mfprintf(((double)lVar2 / (double)point) * 100.0,*(undefined8 *)((long)clientp + 0x18),
                  &frac,local_138);
  }
  fflush(*(FILE **)((long)clientp + 0x18));
  *(long *)((long)clientp + 8) = lVar2;
  return 0;
}

Assistant:

int tool_progress_cb(void *clientp,
                     double dltotal, double dlnow,
                     double ultotal, double ulnow)
{
  /* The original progress-bar source code was written for curl by Lars Aas,
     and this new edition inherits some of his concepts. */

  char line[MAX_BARLENGTH+1];
  char format[40];
  double frac;
  double percent;
  int barwidth;
  int num;
  int i;

  struct ProgressData *bar = (struct ProgressData *)clientp;

  /* expected transfer size */
  curl_off_t total = (curl_off_t)dltotal + (curl_off_t)ultotal +
    bar->initial_size;

  /* we've come this far */
  curl_off_t point = (curl_off_t)dlnow + (curl_off_t)ulnow +
    bar->initial_size;

  if(point > total)
    /* we have got more than the expected total! */
    total = point;

  /* simply count invokes */
  bar->calls++;

  if(total < 1) {
    curl_off_t prevblock = bar->prev / 1024;
    curl_off_t thisblock = point / 1024;
    while(thisblock > prevblock) {
      fprintf(bar->out, "#");
      prevblock++;
    }
  }
  else if(point != bar->prev) {
    frac = (double)point / (double)total;
    percent = frac * 100.0f;
    barwidth = bar->width - 7;
    num = (int) (((double)barwidth) * frac);
    if(num > MAX_BARLENGTH)
      num = MAX_BARLENGTH;
    for(i = 0; i < num; i++)
      line[i] = '#';
    line[i] = '\0';
    snprintf(format, sizeof(format), "\r%%-%ds %%5.1f%%%%", barwidth);
    fprintf(bar->out, format, line, percent);
  }
  fflush(bar->out);
  bar->prev = point;

  return 0;
}